

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

MIR_reg_t get_reload_hreg(gen_ctx_t gen_ctx,MIR_reg_t var,MIR_reg_t type,int out_p)

{
  uint uVar1;
  int iVar2;
  ra_ctx *prVar3;
  uint uVar4;
  uint uVar5;
  MIR_reg_t MVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  
  prVar3 = gen_ctx->ra_ctx;
  lVar11 = 0x1e8;
  uVar7 = (ulong)(out_p != 0);
  if (out_p == 0) {
    lVar11 = 0x188;
  }
  lVar9 = 0;
  uVar1 = *(uint *)((long)prVar3->in_reloads + uVar7 * 4 + -8);
  uVar5 = type - 8;
  uVar8 = 0;
  do {
    if ((ulong)(~((int)uVar1 >> 0x1f) & uVar1) * 0xc - lVar9 == 0) {
      if (1 < uVar8) {
        __assert_fail("rld_num <= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1e66,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
      }
      if (type == 10) {
        MVar6 = 0xffffffff;
      }
      else {
        if ((type == 9) || (type == 8)) {
          iVar2 = 0x19;
        }
        else {
          iVar2 = 0xb;
        }
        MVar6 = iVar2 - (uint)(uVar8 == 0);
      }
      *(uint *)((long)prVar3->in_reloads + uVar7 * 4 + -8) = uVar1 + 1;
      if ((int)uVar1 < 8) {
        lVar9 = (long)(int)uVar1 * 0xc;
        *(MIR_reg_t *)((long)prVar3->lr_gap_bitmaps + lVar9 + lVar11 + -0x3c) = var;
        *(MIR_reg_t *)((long)prVar3->lr_gap_bitmaps + lVar9 + lVar11 + -0x40) = type;
        *(MIR_reg_t *)((long)prVar3->lr_gap_bitmaps + lVar9 + lVar11 + -0x38) = MVar6;
        return MVar6;
      }
      __assert_fail("rld_num < (2 * 4)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1e69,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
    }
    if ((var != 0xffffffff) &&
       (*(MIR_reg_t *)((long)prVar3->lr_gap_bitmaps + lVar9 + lVar11 + -0x3c) == var)) {
      return *(MIR_reg_t *)((long)prVar3->lr_gap_bitmaps + lVar9 + lVar11 + -0x38);
    }
    iVar2 = *(int *)((long)prVar3->lr_gap_bitmaps + lVar9 + lVar11 + -0x38);
    if (uVar8 == 0) {
      iVar10 = 10;
      if (uVar5 < 3) {
        iVar10 = *(int *)(&DAT_0017e880 + (ulong)uVar5 * 4);
      }
      uVar4 = 1;
      if (iVar2 != iVar10) goto LAB_00144938;
    }
    else {
LAB_00144938:
      iVar10 = 0xb;
      if (uVar5 < 3) {
        iVar10 = *(int *)(&DAT_0017e88c + (ulong)uVar5 * 4);
      }
      uVar4 = uVar8;
      if (iVar2 == iVar10) {
        uVar4 = 2;
      }
    }
    uVar8 = uVar4;
    lVar9 = lVar9 + 0xc;
  } while( true );
}

Assistant:

static MIR_reg_t get_reload_hreg (gen_ctx_t gen_ctx, MIR_reg_t var, MIR_reg_t type, int out_p) {
  MIR_reg_t hr;
  insn_reload_t *reloads = out_p ? out_reloads : in_reloads;
  int rld_num = 0, *reloads_num = out_p ? &out_reloads_num : &in_reloads_num;

  for (int i = 0; i < *reloads_num; i++) {
    if (var != MIR_NON_VAR && reloads[i].var == var) return reloads[i].hreg;
    if (rld_num == 0 && reloads[i].hreg == get_temp_hard_reg (type, TRUE))
      rld_num = 1;
    else if (reloads[i].hreg == get_temp_hard_reg (type, FALSE))
      rld_num = 2;
  }
  gen_assert (rld_num <= 1);
  hr = get_temp_hard_reg (type, rld_num == 0);
  rld_num = (*reloads_num)++;
  gen_assert (rld_num < MAX_INSN_RELOADS);
  reloads[rld_num].var = var;
  reloads[rld_num].type = type;
  reloads[rld_num].hreg = hr;
  return hr;
}